

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O1

void __thiscall
spvtools::disassemble::InstructionDisassembler::EmitMaskOperand
          (InstructionDisassembler *this,ostream *stream,spv_operand_type_t type,uint32_t word)

{
  char *pcVar1;
  spv_result_t sVar2;
  size_t sVar3;
  int iVar4;
  uint operand;
  spv_operand_desc entry;
  spv_operand_desc local_38;
  
  if (word != 0) {
    operand = 1;
    iVar4 = 0;
    do {
      if ((operand & word) != 0) {
        sVar2 = AssemblyGrammar::lookupOperand(this->grammar_,type,operand,&local_38);
        if (sVar2 != SPV_SUCCESS) {
          __assert_fail("false && \"should have caught this earlier\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/disassemble.cpp"
                        ,0x3e2,
                        "void spvtools::disassemble::InstructionDisassembler::EmitMaskOperand(std::ostream &, const spv_operand_type_t, const uint32_t) const"
                       );
        }
        if (iVar4 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(stream,"|",1);
        }
        pcVar1 = local_38->name;
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
        }
        else {
          sVar3 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar1,sVar3);
        }
        word = word ^ operand;
        iVar4 = iVar4 + 1;
      }
      operand = operand * 2;
    } while (word != 0);
    if (iVar4 != 0) {
      return;
    }
  }
  sVar2 = AssemblyGrammar::lookupOperand(this->grammar_,type,0,&local_38);
  if (sVar2 == SPV_SUCCESS) {
    pcVar1 = local_38->name;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
    }
    else {
      sVar3 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar1,sVar3);
    }
  }
  return;
}

Assistant:

void InstructionDisassembler::EmitMaskOperand(std::ostream& stream,
                                              const spv_operand_type_t type,
                                              const uint32_t word) const {
  // Scan the mask from least significant bit to most significant bit.  For each
  // set bit, emit the name of that bit. Separate multiple names with '|'.
  uint32_t remaining_word = word;
  uint32_t mask;
  int num_emitted = 0;
  for (mask = 1; remaining_word; mask <<= 1) {
    if (remaining_word & mask) {
      remaining_word ^= mask;
      spv_operand_desc entry;
      if (grammar_.lookupOperand(type, mask, &entry))
        assert(false && "should have caught this earlier");
      if (num_emitted) stream << "|";
      stream << entry->name;
      num_emitted++;
    }
  }
  if (!num_emitted) {
    // An operand value of 0 was provided, so represent it by the name
    // of the 0 value. In many cases, that's "None".
    spv_operand_desc entry;
    if (SPV_SUCCESS == grammar_.lookupOperand(type, 0, &entry))
      stream << entry->name;
  }
}